

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xor_example.c
# Opt level: O2

int main(int argc,char **argv)

{
  data_val_t *pdVar1;
  net_t *n;
  layer_t *plVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  n = net_create(5,1,4);
  plVar2 = fc_layer(2,2,3,0.5,0.0);
  net_add(n,plVar2);
  plVar2 = tanh_layer(2);
  net_add(n,plVar2);
  plVar2 = fc_layer(2,1,3,0.5,0.0);
  net_add(n,plVar2);
  plVar2 = sigmoid_layer(1);
  net_add(n,plVar2);
  plVar2 = mse_layer(1);
  net_add(n,plVar2);
  net_finish(n);
  iVar3 = 3000;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    net_train(n,feed_data,10.0);
  }
  feed_data(n);
  net_forward(n);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pdVar1 = ((*n->layer)->in).val;
    printf("input %f %f, output %f\n",(double)pdVar1[lVar4 * 2],(double)pdVar1[lVar4 * 2 + 1],
           (double)(n->layer[(long)n->size + -1]->in).val[lVar4]);
  }
  net_destroy(n);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	int i = 0;
	float rate = 10;

	net_t *n = net_create(5, TRAIN_SGD, 4);

	net_add(n, fc_layer(2, 2, FILLER_XAVIER, 0.5, 0));
	net_add(n, tanh_layer(2));
	net_add(n, fc_layer(2, 1, FILLER_XAVIER, 0.5, 0));
	net_add(n, sigmoid_layer(1));
	net_add(n, mse_layer(1));

	net_finish(n);

	for (i = 0; i < 3000; ++i)
	{
		//LOG("train with rate %f\n", rate);
		net_train(n, feed_data, rate);
	}

	feed_data(n);
	net_forward(n);
	for (i = 0; i < 4; ++i)
	{
		LOG("input %f %f, output %f\n", n->layer[0]->in.val[2 * i], n->layer[0]->in.val[2 * i + 1], LAST_LAYER(n)->in.val[i]);
	}

	net_destroy(n);

	return 0;
}